

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_integrand_err2(void *void_m_diag_sys_hess,REF_DBL theta_over_2pi,REF_DBL *radial_error)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double __x;
  double dVar12;
  REF_DBL derr_dr2;
  REF_DBL r;
  REF_DBL err;
  REF_DBL *hess;
  REF_DBL xyz [3];
  REF_DBL h1;
  REF_DBL h0;
  REF_DBL yy;
  REF_DBL xx;
  REF_DBL theta;
  REF_DBL *m_diag_sys_hess;
  REF_DBL *radial_error_local;
  REF_DBL theta_over_2pi_local;
  void *void_m_diag_sys_hess_local;
  
  dVar6 = cos(theta_over_2pi * 6.28318530717958);
  dVar7 = sin(theta_over_2pi * 6.28318530717958);
  dVar8 = sqrt(*void_m_diag_sys_hess);
  dVar9 = sqrt(*(double *)((long)void_m_diag_sys_hess + 8));
  dVar10 = (1.0 / dVar8) * *(double *)((long)void_m_diag_sys_hess + 0x18) * dVar6 +
           (1.0 / dVar9) * *(double *)((long)void_m_diag_sys_hess + 0x30) * dVar7;
  dVar11 = (1.0 / dVar8) * *(double *)((long)void_m_diag_sys_hess + 0x20) * dVar6 +
           (1.0 / dVar9) * *(double *)((long)void_m_diag_sys_hess + 0x38) * dVar7;
  dVar6 = *(double *)((long)void_m_diag_sys_hess + 0x60);
  dVar7 = *(double *)((long)void_m_diag_sys_hess + 0x68);
  dVar8 = *(double *)((long)void_m_diag_sys_hess + 0x70);
  dVar9 = *(double *)((long)void_m_diag_sys_hess + 0x68);
  dVar1 = *(double *)((long)void_m_diag_sys_hess + 0x78);
  dVar2 = *(double *)((long)void_m_diag_sys_hess + 0x80);
  dVar3 = *(double *)((long)void_m_diag_sys_hess + 0x70);
  dVar4 = *(double *)((long)void_m_diag_sys_hess + 0x80);
  dVar5 = *(double *)((long)void_m_diag_sys_hess + 0x88);
  __x = sqrt(dVar10 * dVar10 + dVar11 * dVar11 + 0.0);
  dVar12 = pow(__x,4.0);
  *radial_error =
       (((((dVar5 * 0.0 + dVar3 * dVar10 + dVar4 * dVar11) * 0.0 +
          dVar10 * (dVar8 * 0.0 + dVar6 * dVar10 + dVar7 * dVar11) +
          dVar11 * (dVar2 * 0.0 + dVar9 * dVar10 + dVar1 * dVar11)) / __x) / __x) * 6.28318530717958
       * dVar12) / 4.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrand_err2(void *void_m_diag_sys_hess,
                                             REF_DBL theta_over_2pi,
                                             REF_DBL *radial_error) {
  REF_DBL *m_diag_sys_hess = (REF_DBL *)void_m_diag_sys_hess;
  REF_DBL theta = 2.0 * ref_math_pi * theta_over_2pi;
  REF_DBL xx, yy;
  REF_DBL h0, h1;
  REF_DBL xyz[3];
  REF_DBL *hess;
  REF_DBL err, r, derr_dr2;
  xx = cos(theta);
  yy = sin(theta);
  h0 = 1.0 / sqrt(m_diag_sys_hess[0]);
  h1 = 1.0 / sqrt(m_diag_sys_hess[1]);
  xyz[0] = h0 * m_diag_sys_hess[3] * xx + h1 * m_diag_sys_hess[6] * yy;
  xyz[1] = h0 * m_diag_sys_hess[4] * xx + h1 * m_diag_sys_hess[7] * yy;
  xyz[2] = 0.0;
  hess = &(m_diag_sys_hess[12]);
  err = ref_matrix_vt_m_v(hess, xyz);
  r = sqrt(ref_math_dot(xyz, xyz));
  /* assume error = derr_dr2 * r * r */
  derr_dr2 = err / r / r;
  /* integrate 2 * pi * r * error or 2 * pi * r^4/4 * derr_dr2 */
  *radial_error = 2 * ref_math_pi * derr_dr2 * pow(r, 4) / 4.0;
  /* printf("theta %f r %f derr_dr2 %f\n",theta,r,derr_dr2); */
  return REF_SUCCESS;
}